

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionModelMappingSparse.h
# Opt level: O1

double __thiscall
TransitionModelMappingSparse::Get(TransitionModelMappingSparse *this,Index sI,Index jaI,Index sucSI)

{
  sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  local_28;
  
  local_28.
  super_container_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  .c_ = (this->_m_T).
        super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start[jaI];
  local_28.i_ = (size_type)sI;
  local_28.j_ = (size_type)sucSI;
  boost::numeric::ublas::
  sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::get_d(&local_28);
  return local_28.d_;
}

Assistant:

double Get(Index sI, Index jaI, Index sucSI) const
        { return((*_m_T[jaI])(sI,sucSI)); }